

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O0

void ostringstream_suite::test_view(void)

{
  basic_ostream<char,_std::char_traits<char>_> **this;
  size_type size;
  size_t __n;
  undefined1 auVar1 [16];
  string local_208 [48];
  char *msg;
  void *local_1d0;
  undefined1 local_1c4;
  undefined1 local_1c3 [2];
  allocator<char> local_1c1;
  string local_1c0 [8];
  string input;
  undefined1 local_190 [8];
  ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
  container;
  ostringstream output;
  
  this = &container.
          super_basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>.
          content;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
  ::ostream_buffer((ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
                    *)local_190,(basic_ostream<char,_std::char_traits<char>_> *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"alpha",&local_1c1);
  std::allocator<char>::~allocator(&local_1c1);
  size = std::__cxx11::string::size();
  local_1c3[0] = ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
                 ::grow((ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
                         *)local_190,size);
  local_1c4 = 1;
  __n = 0x4d;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(input.size())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x4d,"void ostringstream_suite::test_view()",local_1c3,&local_1c4);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1c0);
  local_1d0 = auVar1._8_8_;
  msg = auVar1._0_8_;
  ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
  ::write((ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
           *)local_190,(int)&msg,local_1d0,__n);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,std::__cxx11::string>
            ("output.str()","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x4f,"void ostringstream_suite::test_view()",local_208,local_1c0);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_1c0);
  ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
  ::~ostream_buffer((ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
                     *)local_190);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &container.
              super_basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>
              .content);
  return;
}

Assistant:

void test_view()
{
    std::ostringstream output;
    ostream_buffer<char> container(output);
    std::string input = "alpha";
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(input.size()), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(input));
    TRIAL_PROTOCOL_TEST_EQUAL(output.str(), input);
}